

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O0

void __thiscall
soul::ArrayWithPreallocation<unsigned_char,_8UL>::resize
          (ArrayWithPreallocation<unsigned_char,_8UL> *this,size_t newSize)

{
  size_t sVar1;
  size_t newSize_local;
  ArrayWithPreallocation<unsigned_char,_8UL> *this_local;
  
  if (this->numActive < newSize) {
    reserve(this,newSize);
    while (this->numActive < newSize) {
      sVar1 = this->numActive;
      this->numActive = sVar1 + 1;
      this->items[sVar1] = '\0';
    }
  }
  else {
    shrink(this,newSize);
  }
  return;
}

Assistant:

void resize (size_t newSize)
    {
        if (newSize > numActive)
        {
            reserve (newSize);

            while (numActive < newSize)
                new (items + numActive++) Item (Item());
        }
        else
        {
            shrink (newSize);
        }
    }